

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall
VectorsTest_Int3ProductAssignment_Test::TestBody(VectorsTest_Int3ProductAssignment_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Int3 v2;
  Int3 v1;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertHelper *this_00;
  int *in_stack_fffffffffffffed8;
  AssertionResult *pAVar2;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined1 uVar3;
  char *in_stack_fffffffffffffee8;
  int line;
  char *in_stack_fffffffffffffef0;
  char *file;
  undefined8 in_stack_fffffffffffffef8;
  Type TVar4;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined1 uVar5;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 uVar6;
  Vector3<int> local_b4;
  AssertionResult local_a8 [2];
  Vector3<int> local_84;
  AssertionResult local_78;
  uint local_64;
  Vector3<int> local_3c;
  AssertionResult local_30;
  Vector3<int> local_20;
  undefined1 local_14 [20];
  
  TVar4 = (Type)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  pica::Vector3<int>::Vector3((Vector3<int> *)local_14,3,5,-2);
  pica::Vector3<int>::Vector3(&local_20,6,-8,2);
  pica::operator*=((Vector3<int> *)local_14,&local_20);
  pica::Vector3<int>::Vector3(&local_3c,0x12,-0x28,-4);
  this_01 = &local_30;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffee8,
             (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  uVar6 = bVar1;
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    testing::AssertionResult::failure_message((AssertionResult *)0x1d908f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),TVar4,
               in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar6,in_stack_ffffffffffffff30),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x1d90ec);
  }
  local_64 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d915a);
  if (local_64 == 0) {
    file = local_14 + 4;
    pica::Vector3<int>::Vector3(&local_84,0x12,-0x28,-4);
    pAVar2 = &local_78;
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_fffffffffffffee8,
               (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar2);
    TVar4 = (Type)((ulong)pAVar2 >> 0x20);
    uVar5 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_ffffffffffffff00));
      in_stack_fffffffffffffee8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1d9228);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar5,in_stack_ffffffffffffff00),TVar4,file,
                 (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar6,in_stack_ffffffffffffff30),(Message *)this_01);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffed0);
      testing::Message::~Message((Message *)0x1d9285);
    }
    local_64 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d92f3);
    if (local_64 == 0) {
      this_00 = (AssertHelper *)(local_14 + 8);
      pica::Vector3<int>::Vector3(&local_b4,0x12,-0x28,-4);
      pAVar2 = local_a8;
      testing::internal::EqHelper<false>::Compare<int,int>
                (in_stack_fffffffffffffee8,
                 (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),(int *)pAVar2
                 ,(int *)this_00);
      line = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar2);
      if (!bVar1) {
        uVar3 = bVar1;
        testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_ffffffffffffff00));
        testing::AssertionResult::failure_message((AssertionResult *)0x1d93be);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar5,in_stack_ffffffffffffff00),TVar4,file,line,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffee0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_ffffffffffffff30),(Message *)this_01);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x1d940a);
      }
      local_64 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d946f);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, Int3ProductAssignment)
{
    Int3 v1(3, 5, -2), v2(6, -8, 2);
    v1 *= v2;
    ASSERT_EQ_INT3(v1, Int3(18, -40, -4));
}